

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O0

void Eigen::internal::
     triangular_assignment_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U,_-1,_true>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *src)

{
  Index IVar1;
  Index IVar2;
  long *plVar3;
  Scalar *pSVar4;
  long local_40;
  Index i_1;
  long local_30;
  Index maxi;
  Index i;
  Index j;
  Matrix<double,__1,__1,_0,__1,__1> *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  i = 0;
  j = (Index)src;
  src_local = dst;
  while( true ) {
    IVar1 = i;
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&src_local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
    ;
    if (IVar2 <= IVar1) break;
    maxi = i;
    while( true ) {
      IVar1 = maxi;
      IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        (&src_local->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
      if (IVar2 <= IVar1) break;
      DenseCoeffsBase<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::
      copyCoeff<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)src_local,maxi,i,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)j);
      maxi = maxi + 1;
    }
    i_1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&src_local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    plVar3 = std::min<long>(&i,&i_1);
    local_30 = *plVar3;
    for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
      pSVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                         (&src_local->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,local_40
                          ,i);
      *pSVar4 = 0.0;
    }
    i = i + 1;
  }
  return;
}

Assistant:

static inline void run(Derived1 &dst, const Derived2 &src)
  {
    for(Index j = 0; j < dst.cols(); ++j)
    {
      for(Index i = j; i < dst.rows(); ++i)
        dst.copyCoeff(i, j, src);
      Index maxi = (std::min)(j, dst.rows());
      if (ClearOpposite)
        for(Index i = 0; i < maxi; ++i)
          dst.coeffRef(i, j) = static_cast<typename Derived1::Scalar>(0);
    }
  }